

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_sizeof_bufferPool(ZSTDMT_bufferPool *bufPool)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  uVar1 = bufPool->totalBuffers;
  pthread_mutex_lock((pthread_mutex_t *)bufPool);
  lVar3 = 0;
  for (lVar2 = 0; (ulong)bufPool->totalBuffers << 4 != lVar2; lVar2 = lVar2 + 0x10) {
    lVar3 = lVar3 + *(long *)((long)&bufPool->bTable[0].capacity + lVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)bufPool);
  return (ulong)(uVar1 - 1) * 0x10 + lVar3 + 0x60;
}

Assistant:

static size_t ZSTDMT_sizeof_bufferPool(ZSTDMT_bufferPool* bufPool)
{
    size_t const poolSize = sizeof(*bufPool)
                          + (bufPool->totalBuffers - 1) * sizeof(buffer_t);
    unsigned u;
    size_t totalBufferSize = 0;
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    for (u=0; u<bufPool->totalBuffers; u++)
        totalBufferSize += bufPool->bTable[u].capacity;
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);

    return poolSize + totalBufferSize;
}